

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

bool __thiscall
QFormLayoutPrivate::setItem(QFormLayoutPrivate *this,int row,ItemRole role,QLayoutItem *item)

{
  int iVar1;
  pointer ppQVar2;
  QFormLayoutItem *pQVar3;
  bool bVar4;
  char *pcVar5;
  ItemRole IVar6;
  long in_FS_OFFSET;
  undefined8 local_58;
  undefined1 auStack_50 [12];
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  IVar6 = FieldRole;
  if (role != SpanningRole) {
    IVar6 = role;
  }
  if ((IVar6 < SpanningRole) && ((uint)row < (uint)((ulong)(this->m_matrix).m_storage.d.size >> 1)))
  {
    if (item == (QLayoutItem *)0x0) {
      bVar4 = false;
      goto LAB_003a1089;
    }
    iVar1 = IVar6 + row * 2;
    ppQVar2 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
    if (ppQVar2[iVar1] == (QFormLayoutItem *)0x0) {
      pQVar3 = (QFormLayoutItem *)operator_new(0x40);
      pQVar3->item = item;
      pQVar3->isVisible = true;
      pQVar3->isHfw = false;
      (pQVar3->minSize).wd.m_i = -1;
      (pQVar3->minSize).ht.m_i = -1;
      (pQVar3->sizeHint).wd.m_i = -1;
      (pQVar3->sizeHint).ht.m_i = -1;
      (pQVar3->maxSize).wd.m_i = -1;
      (pQVar3->maxSize).ht.m_i = -1;
      pQVar3->sbsHSpace = -1;
      pQVar3->vSpace = -1;
      pQVar3->sideBySide = false;
      pQVar3->vLayoutIndex = -1;
      pQVar3->layoutPos = -1;
      pQVar3->layoutWidth = -1;
      pQVar3->fullRow = role == SpanningRole;
      ppQVar2 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
      ppQVar2[iVar1] = pQVar3;
      local_58._0_4_ = SUB84(pQVar3,0);
      local_58._4_4_ = (undefined4)((ulong)pQVar3 >> 0x20);
      QtPrivate::QPodArrayOps<QFormLayoutItem*>::emplace<QFormLayoutItem*&>
                ((QPodArrayOps<QFormLayoutItem*> *)&this->m_things,(this->m_things).d.size,
                 (QFormLayoutItem **)&local_58);
      QList<QFormLayoutItem_*>::end(&this->m_things);
      bVar4 = true;
      goto LAB_003a1089;
    }
    pcVar5 = "QFormLayoutPrivate::setItem: Cell (%d, %d) already occupied";
  }
  else {
    pcVar5 = "QFormLayoutPrivate::setItem: Invalid cell (%d, %d)";
  }
  local_40 = "default";
  local_44 = 0;
  auStack_50 = SUB1612((undefined1  [16])0x0,4);
  local_58._4_4_ = 0;
  local_58._0_4_ = 2;
  bVar4 = false;
  QMessageLogger::warning((char *)&local_58,pcVar5,(ulong)(uint)row,(ulong)IVar6);
LAB_003a1089:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QFormLayoutPrivate::setItem(int row, QFormLayout::ItemRole role, QLayoutItem *item)
{
    const bool fullRow = role == QFormLayout::SpanningRole;
    const int column =  role == QFormLayout::SpanningRole ? 1 : static_cast<int>(role);
    if (Q_UNLIKELY(uint(row) >= uint(m_matrix.rowCount()) || uint(column) > 1U)) {
        qWarning("QFormLayoutPrivate::setItem: Invalid cell (%d, %d)", row, column);
        return false;
    }

    if (!item)
        return false;

    if (Q_UNLIKELY(m_matrix(row, column))) {
        qWarning("QFormLayoutPrivate::setItem: Cell (%d, %d) already occupied", row, column);
        return false;
    }

    QFormLayoutItem *i = new QFormLayoutItem(item);
    i->fullRow = fullRow;
    m_matrix(row, column) = i;

    m_things.append(i);
    return true;
}